

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UI.cpp
# Opt level: O0

void __thiscall
UI::showDeliveryPath
          (UI *this,vector<int,_std::allocator<int>_> *path,vector<int,_std::allocator<int>_> *POIs)

{
  Graph<std::pair<double,_double>_> *pGVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int y;
  GraphViewer *pGVar5;
  reference pvVar6;
  ulong uVar7;
  size_type sVar8;
  allocator local_a1;
  string local_a0 [32];
  pair<double,_double> local_80;
  pair<double,_double> local_70;
  int local_5c;
  undefined1 auStack_58 [4];
  int i;
  double local_50;
  pair<double,_double> local_48;
  Vertex<std::pair<double,_double>_> *local_38;
  Vertex<std::pair<double,_double>_> *a;
  int current_POI;
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *POIs_local;
  vector<int,_std::allocator<int>_> *path_local;
  UI *this_local;
  
  local_20 = POIs;
  POIs_local = path;
  path_local = (vector<int,_std::allocator<int>_> *)this;
  pGVar5 = (GraphViewer *)operator_new(0x18);
  GraphViewer::GraphViewer(pGVar5,this->gv_width,this->gv_height,false);
  this->gv = pGVar5;
  GraphViewer::defineEdgeCurved(this->gv,false);
  GraphViewer::defineVertexSize(this->gv,3);
  GraphViewer::createWindow(this->gv,this->gv_width,this->gv_height);
  a._0_4_ = -1;
  bVar2 = std::vector<int,_std::allocator<int>_>::empty(POIs);
  if (!bVar2) {
    a._0_4_ = 0;
  }
  pGVar1 = this->graph;
  pvVar6 = std::vector<int,_std::allocator<int>_>::at(path,0);
  local_38 = Graph<std::pair<double,_double>_>::findVertex(pGVar1,pvVar6);
  pGVar5 = this->gv;
  local_48 = Vertex<std::pair<double,_double>_>::getInfo(local_38);
  iVar3 = x_fitted(this,local_48.first);
  _auStack_58 = Vertex<std::pair<double,_double>_>::getInfo(local_38);
  iVar4 = y_fitted(this,local_50);
  GraphViewer::addNode(pGVar5,0,iVar3,iVar4);
  if ((int)a != -1) {
    iVar3 = Vertex<std::pair<double,_double>_>::getId(local_38);
    pvVar6 = std::vector<int,_std::allocator<int>_>::at(POIs,(long)(int)a);
    if (iVar3 == *pvVar6) {
      setPOIProperties(this,local_38,0,(int)a);
      a._0_4_ = (int)a + 1;
      uVar7 = (ulong)(int)a;
      sVar8 = std::vector<int,_std::allocator<int>_>::size(POIs);
      if (sVar8 <= uVar7) {
        a._0_4_ = -1;
      }
    }
  }
  for (local_5c = 1; uVar7 = (ulong)local_5c,
      sVar8 = std::vector<int,_std::allocator<int>_>::size(path), uVar7 < sVar8;
      local_5c = local_5c + 1) {
    pGVar1 = this->graph;
    pvVar6 = std::vector<int,_std::allocator<int>_>::at(path,(long)local_5c);
    local_38 = Graph<std::pair<double,_double>_>::findVertex(pGVar1,pvVar6);
    iVar3 = local_5c;
    pGVar5 = this->gv;
    local_70 = Vertex<std::pair<double,_double>_>::getInfo(local_38);
    iVar4 = x_fitted(this,local_70.first);
    local_80 = Vertex<std::pair<double,_double>_>::getInfo(local_38);
    y = y_fitted(this,local_80.second);
    GraphViewer::addNode(pGVar5,iVar3,iVar4,y);
    if ((int)a != -1) {
      iVar3 = Vertex<std::pair<double,_double>_>::getId(local_38);
      pvVar6 = std::vector<int,_std::allocator<int>_>::at(POIs,(long)(int)a);
      if (iVar3 == *pvVar6) {
        setPOIProperties(this,local_38,local_5c,(int)a);
        a._0_4_ = (int)a + 1;
        uVar7 = (ulong)(int)a;
        sVar8 = std::vector<int,_std::allocator<int>_>::size(POIs);
        if (sVar8 <= uVar7) {
          a._0_4_ = -1;
        }
      }
    }
    GraphViewer::addEdge(this->gv,local_5c,local_5c + -1,local_5c,1);
  }
  GraphViewer::rearrange(this->gv);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"ENTER to go back",&local_a1);
  enterWait((string *)local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  if (this->gv != (GraphViewer *)0x0) {
    operator_delete(this->gv,0x18);
  }
  return;
}

Assistant:

void UI::showDeliveryPath(vector<int> path, vector<int> POIs) {
    this->gv = new GraphViewer(gv_width, gv_height, false);
    gv->defineEdgeCurved(false);
    gv->defineVertexSize(3);
    gv->createWindow(gv_width, gv_height);
    int current_POI = -1;

    if (!POIs.empty()) {
        current_POI = 0;
    }

    Vertex<coordinates> *a = graph->findVertex(path.at(0));
    gv->addNode(0, x_fitted(a->getInfo().first), y_fitted(a->getInfo().second));
    if (current_POI != -1 && a->getId() == POIs.at(current_POI)) {
        setPOIProperties(a, 0, current_POI);
        if (++current_POI >= POIs.size()) { current_POI = -1; }
    }

    for (int i = 1; i < path.size(); i++) {
        a = graph->findVertex(path.at(i));

        gv->addNode(i, x_fitted(a->getInfo().first), y_fitted(a->getInfo().second));
        if (current_POI != -1 && a->getId() == POIs.at(current_POI)) {
            setPOIProperties(a, i, current_POI);
            if (++current_POI >= POIs.size()) { current_POI = -1; }
        }
        gv->addEdge(i, i-1, i, EdgeType::DIRECTED);
    }

    gv->rearrange();

    enterWait();
    delete gv;
}